

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangle.hpp
# Opt level: O3

void __thiscall
Triangle::Triangle(Triangle *this,vec3f v1,vec3f v2,vec3f v3,vec2f vt1,vec2f vt2,vec2f vt3,vec3f vn1
                  ,vec3f vn2,vec3f vn3)

{
  undefined1 auVar1 [16];
  data_t (*padVar2) [3];
  undefined8 *puVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  float fVar12;
  uint in_XMM3_Db;
  uint in_XMM3_Dc;
  uint in_XMM3_Dd;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  mat3f res;
  float local_d0 [4];
  float local_c0;
  float local_bc;
  float local_b8;
  float local_b4;
  float local_b0;
  float local_a8;
  uint uStack_a4;
  uint uStack_a0;
  uint uStack_9c;
  float local_98;
  float fStack_94;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  float local_78;
  float fStack_74;
  float local_68;
  float local_58;
  float fStack_54;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  data_t local_28;
  
  local_b4 = v3.z;
  local_68 = v2.z;
  local_78 = v2.x;
  fStack_74 = v2.y;
  fVar13 = v1.z;
  fVar12 = v1.x;
  local_88 = v1.y;
  (this->super_BasicPrimitive).super_Primitive._vptr_Primitive =
       (_func_int **)&PTR_intersect_001b6ba0;
  (this->v1).x = (data_t)(int)v1._0_8_;
  (this->v1).y = (data_t)(int)((ulong)v1._0_8_ >> 0x20);
  (this->v1).z = fVar13;
  (this->v2).x = (data_t)(int)v2._0_8_;
  (this->v2).y = (data_t)(int)((ulong)v2._0_8_ >> 0x20);
  (this->v2).z = local_68;
  (this->v3).x = (data_t)(int)v3._0_8_;
  (this->v3).y = (data_t)(int)((ulong)v3._0_8_ >> 0x20);
  (this->v3).z = local_b4;
  (this->vn1).z = vn1.z;
  (this->vn1).x = (data_t)(int)vn1._0_8_;
  (this->vn1).y = (data_t)(int)((ulong)vn1._0_8_ >> 0x20);
  (this->vn2).x = vn2.x;
  (this->vn2).y = vn2.y;
  (this->vn2).z = vn2.z;
  (this->vn3).x = vn3.x;
  (this->vn3).y = vn3.y;
  (this->vn3).z = vn3.z;
  auVar1._8_4_ = vt2.x;
  auVar1._0_8_ = vt1;
  auVar1._12_4_ = vt2.y;
  this->vt1 = vt1;
  (this->vt2).x = (data_t)(int)auVar1._8_8_;
  (this->vt2).y = (data_t)(int)((ulong)auVar1._8_8_ >> 0x20);
  this->vt3 = vt3;
  *(data_t *)((long)((this->tMatrix).data + 0) + 0) = 0.0;
  *(data_t *)((long)((this->tMatrix).data + 0) + 4) = 0.0;
  *(undefined8 *)((this->tMatrix).data[0] + 2) = 0;
  padVar2 = (this->tMatrix).data;
  *(data_t *)((long)(padVar2 + 1) + 4) = 0.0;
  *(data_t *)((long)(padVar2 + 1) + 8) = 0.0;
  *(data_t *)((long)((this->tMatrix).data + 2) + 0) = 0.0;
  *(data_t *)((long)((this->tMatrix).data + 2) + 4) = 0.0;
  *(undefined8 *)((this->tMatrix).data[2] + 2) = 0;
  (this->planeNormal).y = 0.0;
  (this->planeNormal).z = 0.0;
  if (SQRT((fVar13 - local_68) * (fVar13 - local_68) +
           (fVar12 - local_78) * (fVar12 - local_78) +
           (local_88 - fStack_74) * (local_88 - fStack_74)) <= 0.0) {
    __assert_fail("norm(v1-v2)>0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/rt/triangle.hpp"
                  ,0x18,
                  "Triangle::Triangle(vec3f, vec3f, vec3f, vec2f, vec2f, vec2f, vec3f, vec3f, vec3f)"
                 );
  }
  local_d0[1] = v3.x;
  fStack_54 = v3.y;
  if (SQRT((fVar13 - local_b4) * (fVar13 - local_b4) +
           (fVar12 - local_d0[1]) * (fVar12 - local_d0[1]) +
           (local_88 - fStack_54) * (local_88 - fStack_54)) <= 0.0) {
    __assert_fail("norm(v1-v3)>0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/rt/triangle.hpp"
                  ,0x19,
                  "Triangle::Triangle(vec3f, vec3f, vec3f, vec2f, vec2f, vec2f, vec3f, vec3f, vec3f)"
                 );
  }
  if (SQRT((local_68 - local_b4) * (local_68 - local_b4) +
           (local_78 - local_d0[1]) * (local_78 - local_d0[1]) +
           (fStack_74 - fStack_54) * (fStack_74 - fStack_54)) <= 0.0) {
    __assert_fail("norm(v2-v3)>0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/rt/triangle.hpp"
                  ,0x1a,
                  "Triangle::Triangle(vec3f, vec3f, vec3f, vec2f, vec2f, vec2f, vec3f, vec3f, vec3f)"
                 );
  }
  local_78 = local_78 - fVar12;
  local_d0[3] = fStack_74 - local_88;
  local_68 = local_68 - fVar13;
  fVar16 = 1.0 / SQRT(local_68 * local_68 + local_78 * local_78 + local_d0[3] * local_d0[3]);
  local_d0[1] = local_d0[1] - fVar12;
  local_88 = fStack_54 - local_88;
  local_b4 = local_b4 - fVar13;
  fVar14 = 1.0 / SQRT(local_b4 * local_b4 + local_d0[1] * local_d0[1] + local_88 * local_88);
  local_58 = local_d0[1] * fVar14;
  fVar12 = local_88 * fVar14;
  fVar14 = fVar14 * local_b4;
  fVar13 = local_d0[3] * fVar16 * fVar14 - fVar12 * fVar16 * local_68;
  fVar17 = fVar16 * local_68 * local_58 - fVar14 * local_78 * fVar16;
  fVar16 = local_78 * fVar16 * fVar12 - local_58 * local_d0[3] * fVar16;
  if (1e-09 < SQRT(fVar16 * fVar16 + fVar13 * fVar13 + fVar17 * fVar17)) {
    local_a8 = -local_68;
    uStack_a4 = in_XMM3_Db ^ 0x80000000;
    uStack_a0 = in_XMM3_Dc ^ 0x80000000;
    uStack_9c = in_XMM3_Dd ^ 0x80000000;
    fVar15 = local_d0[3] * local_b4 - local_88 * local_68;
    fVar13 = local_68 * local_d0[1] - local_b4 * local_78;
    local_98 = local_d0[1] * local_d0[3];
    fStack_84 = fStack_54;
    fStack_80 = fStack_54;
    fStack_7c = fStack_54;
    fVar18 = local_78 * local_88;
    fStack_94 = fStack_54;
    fVar17 = fVar18 - local_98;
    fVar16 = 1.0 / SQRT(fVar17 * fVar17 + fVar15 * fVar15 + fVar13 * fVar13);
    fVar15 = fVar15 * fVar16;
    fVar13 = fVar13 * fVar16;
    fVar16 = fVar16 * fVar17;
    (this->planeNormal).x = fVar15;
    (this->planeNormal).y = fVar13;
    (this->planeNormal).z = fVar16;
    if (vn1.z * fVar16 + vn1.x * fVar15 + vn1.y * fVar13 < 0.0) {
      (this->planeNormal).x = -fVar15;
      (this->planeNormal).y = -fVar13;
      (this->planeNormal).z = -fVar16;
    }
    fVar13 = local_88 * local_68 - local_d0[3] * local_b4;
    fVar16 = local_b4 * local_78 - local_68 * local_d0[1];
    this->one_by_2S =
         1.0 / SQRT((local_98 - fVar18) * (local_98 - fVar18) + fVar13 * fVar13 + fVar16 * fVar16);
    local_d0[2] = local_d0[3] * fVar14 + -local_68 * fVar12;
    local_bc = local_68 * local_58 + fVar14 * -local_78;
    local_b0 = fVar12 * local_78 + -local_d0[3] * local_58;
    local_d0[0] = local_78;
    local_c0 = local_88;
    local_b8 = local_68;
    puVar3 = &local_48;
    local_48 = 0;
    uStack_40 = 0;
    local_38 = 0;
    uStack_30 = 0;
    local_28 = 0.0;
    lVar4 = 0;
    do {
      lVar5 = lVar4 + 1;
      lVar6 = lVar5;
      if (lVar5 == 3) {
        lVar6 = 0;
      }
      uVar7 = ((int)lVar4 + 2U) % 3;
      uVar8 = 0xffffffff;
      lVar4 = 1;
      lVar10 = 0;
      do {
        lVar11 = 0;
        if (lVar10 != 0x18) {
          lVar11 = lVar4;
        }
        uVar9 = (ulong)uVar8;
        if (lVar10 == 0) {
          uVar9 = 2;
        }
        *(float *)((long)puVar3 + lVar10) =
             (local_d0[lVar6 * 3 + lVar11] * local_d0[(ulong)uVar7 * 3 + uVar9] -
             local_d0[lVar6 * 3 + uVar9] * local_d0[(ulong)uVar7 * 3 + lVar11]) *
             (1.0 / (((local_bc * -local_78 * local_b4 +
                      local_d0[3] * local_d0[2] * local_b4 +
                      fVar18 * local_b0 + local_d0[1] * local_bc * local_68) - local_b0 * local_98)
                    - local_d0[2] * local_88 * local_68));
        lVar10 = lVar10 + 0xc;
        uVar8 = uVar8 + 1;
        lVar4 = lVar4 + 1;
      } while (lVar10 != 0x24);
      puVar3 = (undefined8 *)((long)puVar3 + 4);
      lVar4 = lVar5;
    } while (lVar5 != 3);
    (this->tMatrix).data[2][2] = local_28;
    *(undefined8 *)((this->tMatrix).data[1] + 1) = local_38;
    *(undefined8 *)(this->tMatrix).data[2] = uStack_30;
    *(undefined8 *)(this->tMatrix).data[0] = local_48;
    *(undefined8 *)((this->tMatrix).data[0] + 2) = uStack_40;
    return;
  }
  __assert_fail("norm(cross(normalized(v2-v1), normalized(v3-v1))) > 1e-9",
                "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/rt/triangle.hpp"
                ,0x1b,
                "Triangle::Triangle(vec3f, vec3f, vec3f, vec2f, vec2f, vec2f, vec3f, vec3f, vec3f)")
  ;
}

Assistant:

Triangle(vec3f v1, vec3f v2, vec3f v3, vec2f vt1, vec2f vt2, vec2f vt3, vec3f vn1, vec3f vn2, vec3f vn3):
		v1(v1), v2(v2), v3(v3), vn1(vn1), vn2(vn2), vn3(vn3), vt1(vt1), vt2(vt2), vt3(vt3)
	// pre-calculation to accelerate intersection / interpolation computation
	{
		// NOTE: be careful when dealing with tiny triangles!
		assert(norm(v1-v2)>0);
		assert(norm(v1-v3)>0);
		assert(norm(v2-v3)>0);
		assert(norm(cross(normalized(v2-v1), normalized(v3-v1))) > 1e-9);

		planeNormal = normalized(cross(v2-v1, v3-v1));
		// make sure plane normal points outward
		if (dot(planeNormal, vn1) < 0)
			planeNormal *= -1;
		one_by_2S = 1 / norm(cross(v3-v1, v2-v1));
		tMatrix = inverse(mat3f(v2-v1, v3-v1, cross(v2-v1, normalized(v3-v1))));
	}